

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O1

bool __thiscall
QAbstractItemView::eventFilter(QAbstractItemView *this,QObject *object,QEvent *event)

{
  QAbstractItemViewPrivate *this_00;
  Data *this_01;
  bool bVar1;
  QWidget *pQVar2;
  Node<QWidget_*,_QHashDummyValue> *pNVar3;
  long in_FS_OFFSET;
  QWidget *widget;
  QModelIndex QStack_48;
  QWidget *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (object != (QObject *)this) {
    this_00 = *(QAbstractItemViewPrivate **)(this + 8);
    pQVar2 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    if ((pQVar2 != (QWidget *)object) && (*(short *)(event + 8) == 8)) {
      if (object == (QObject *)0x0) {
        local_30 = (QWidget *)0x0;
      }
      else {
        local_30 = (QWidget *)0x0;
        if ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) != 0) {
          local_30 = (QWidget *)object;
        }
      }
      if (((local_30 == (QWidget *)0x0) ||
          (this_01 = (this_00->persistent).q_hash.d, this_01 == (Data *)0x0)) ||
         (pNVar3 = QHashPrivate::Data<QHashPrivate::Node<QWidget*,QHashDummyValue>>::
                   findNode<QWidget*>((Data<QHashPrivate::Node<QWidget*,QHashDummyValue>> *)this_01,
                                      &local_30), pNVar3 == (Node<QWidget_*,_QHashDummyValue> *)0x0)
         ) {
        bVar1 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
      }
      else {
        QAbstractItemViewPrivate::indexForEditor(&QStack_48,this_00,local_30);
        setCurrentIndex(this,&QStack_48);
        bVar1 = false;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return bVar1;
      }
      goto LAB_005473c0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    bVar1 = QAbstractScrollArea::eventFilter((QAbstractScrollArea *)this,object,event);
    return bVar1;
  }
LAB_005473c0:
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemView::eventFilter(QObject *object, QEvent *event)
{
    Q_D(QAbstractItemView);
    if (object == this || object == viewport() || event->type() != QEvent::FocusIn)
        return QAbstractScrollArea::eventFilter(object, event);
    QWidget *widget = qobject_cast<QWidget *>(object);
    // If it is not a persistent widget then we did not install
    // the event filter on it, so assume a base implementation is
    // filtering
    if (!widget || !d->persistent.contains(widget))
        return QAbstractScrollArea::eventFilter(object, event);
    setCurrentIndex(d->indexForEditor(widget));
    return false;
}